

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadLight(ColladaParser *this,Light *pLight)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  ai_real aVar4;
  char *local_20;
  char *content;
  Light *pLight_local;
  ColladaParser *this_local;
  
  content = (char *)pLight;
  pLight_local = (Light *)this;
  do {
    do {
      while( true ) {
        uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((uVar2 & 1) == 0) {
          return;
        }
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar3 != 1) break;
        bVar1 = IsElement(this,"light");
        if (bVar1) {
          SkipElement(this);
        }
        else {
          bVar1 = IsElement(this,"spot");
          if (bVar1) {
            content[0] = '\x03';
            content[1] = '\0';
            content[2] = '\0';
            content[3] = '\0';
          }
          else {
            bVar1 = IsElement(this,"ambient");
            if (bVar1) {
              content[0] = '\x04';
              content[1] = '\0';
              content[2] = '\0';
              content[3] = '\0';
            }
            else {
              bVar1 = IsElement(this,"directional");
              if (bVar1) {
                content[0] = '\x01';
                content[1] = '\0';
                content[2] = '\0';
                content[3] = '\0';
              }
              else {
                bVar1 = IsElement(this,"point");
                if (bVar1) {
                  content[0] = '\x02';
                  content[1] = '\0';
                  content[2] = '\0';
                  content[3] = '\0';
                }
                else {
                  bVar1 = IsElement(this,"color");
                  if (bVar1) {
                    local_20 = GetTextContent(this);
                    local_20 = fast_atoreal_move<float>(local_20,(float *)(content + 4),true);
                    SkipSpacesAndLineEnd<char>(&local_20);
                    local_20 = fast_atoreal_move<float>(local_20,(float *)(content + 8),true);
                    SkipSpacesAndLineEnd<char>(&local_20);
                    local_20 = fast_atoreal_move<float>(local_20,(float *)(content + 0xc),true);
                    SkipSpacesAndLineEnd<char>(&local_20);
                    TestClosing(this,"color");
                  }
                  else {
                    bVar1 = IsElement(this,"constant_attenuation");
                    if (bVar1) {
                      aVar4 = ReadFloatFromTextContent(this);
                      *(ai_real *)(content + 0x10) = aVar4;
                      TestClosing(this,"constant_attenuation");
                    }
                    else {
                      bVar1 = IsElement(this,"linear_attenuation");
                      if (bVar1) {
                        aVar4 = ReadFloatFromTextContent(this);
                        *(ai_real *)(content + 0x14) = aVar4;
                        TestClosing(this,"linear_attenuation");
                      }
                      else {
                        bVar1 = IsElement(this,"quadratic_attenuation");
                        if (bVar1) {
                          aVar4 = ReadFloatFromTextContent(this);
                          *(ai_real *)(content + 0x18) = aVar4;
                          TestClosing(this,"quadratic_attenuation");
                        }
                        else {
                          bVar1 = IsElement(this,"falloff_angle");
                          if (bVar1) {
                            aVar4 = ReadFloatFromTextContent(this);
                            *(ai_real *)(content + 0x1c) = aVar4;
                            TestClosing(this,"falloff_angle");
                          }
                          else {
                            bVar1 = IsElement(this,"falloff_exponent");
                            if (bVar1) {
                              aVar4 = ReadFloatFromTextContent(this);
                              *(ai_real *)(content + 0x20) = aVar4;
                              TestClosing(this,"falloff_exponent");
                            }
                            else {
                              bVar1 = IsElement(this,"outer_cone");
                              if (bVar1) {
                                aVar4 = ReadFloatFromTextContent(this);
                                *(ai_real *)(content + 0x28) = aVar4;
                                TestClosing(this,"outer_cone");
                              }
                              else {
                                bVar1 = IsElement(this,"penumbra_angle");
                                if (bVar1) {
                                  aVar4 = ReadFloatFromTextContent(this);
                                  *(ai_real *)(content + 0x24) = aVar4;
                                  TestClosing(this,"penumbra_angle");
                                }
                                else {
                                  bVar1 = IsElement(this,"intensity");
                                  if (bVar1) {
                                    aVar4 = ReadFloatFromTextContent(this);
                                    *(ai_real *)(content + 0x2c) = aVar4;
                                    TestClosing(this,"intensity");
                                  }
                                  else {
                                    bVar1 = IsElement(this,"falloff");
                                    if (bVar1) {
                                      aVar4 = ReadFloatFromTextContent(this);
                                      *(ai_real *)(content + 0x28) = aVar4;
                                      TestClosing(this,"falloff");
                                    }
                                    else {
                                      bVar1 = IsElement(this,"hotspot_beam");
                                      if (bVar1) {
                                        aVar4 = ReadFloatFromTextContent(this);
                                        *(ai_real *)(content + 0x1c) = aVar4;
                                        TestClosing(this,"hotspot_beam");
                                      }
                                      else {
                                        bVar1 = IsElement(this,"decay_falloff");
                                        if (bVar1) {
                                          aVar4 = ReadFloatFromTextContent(this);
                                          *(ai_real *)(content + 0x28) = aVar4;
                                          TestClosing(this,"decay_falloff");
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar3 != 2);
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar3 = strcmp((char *)CONCAT44(extraout_var,iVar3),"light");
  } while (iVar3 != 0);
  return;
}

Assistant:

void ColladaParser::ReadLight(Collada::Light& pLight)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("light")) {
                SkipElement();
            }
            else if (IsElement("spot")) {
                pLight.mType = aiLightSource_SPOT;
            }
            else if (IsElement("ambient")) {
                pLight.mType = aiLightSource_AMBIENT;
            }
            else if (IsElement("directional")) {
                pLight.mType = aiLightSource_DIRECTIONAL;
            }
            else if (IsElement("point")) {
                pLight.mType = aiLightSource_POINT;
            }
            else if (IsElement("color")) {
                // text content contains 3 floats
                const char* content = GetTextContent();

                content = fast_atoreal_move<ai_real>(content, (ai_real&)pLight.mColor.r);
                SkipSpacesAndLineEnd(&content);

                content = fast_atoreal_move<ai_real>(content, (ai_real&)pLight.mColor.g);
                SkipSpacesAndLineEnd(&content);

                content = fast_atoreal_move<ai_real>(content, (ai_real&)pLight.mColor.b);
                SkipSpacesAndLineEnd(&content);

                TestClosing("color");
            }
            else if (IsElement("constant_attenuation")) {
                pLight.mAttConstant = ReadFloatFromTextContent();
                TestClosing("constant_attenuation");
            }
            else if (IsElement("linear_attenuation")) {
                pLight.mAttLinear = ReadFloatFromTextContent();
                TestClosing("linear_attenuation");
            }
            else if (IsElement("quadratic_attenuation")) {
                pLight.mAttQuadratic = ReadFloatFromTextContent();
                TestClosing("quadratic_attenuation");
            }
            else if (IsElement("falloff_angle")) {
                pLight.mFalloffAngle = ReadFloatFromTextContent();
                TestClosing("falloff_angle");
            }
            else if (IsElement("falloff_exponent")) {
                pLight.mFalloffExponent = ReadFloatFromTextContent();
                TestClosing("falloff_exponent");
            }
            // FCOLLADA extensions
            // -------------------------------------------------------
            else if (IsElement("outer_cone")) {
                pLight.mOuterAngle = ReadFloatFromTextContent();
                TestClosing("outer_cone");
            }
            // ... and this one is even deprecated
            else if (IsElement("penumbra_angle")) {
                pLight.mPenumbraAngle = ReadFloatFromTextContent();
                TestClosing("penumbra_angle");
            }
            else if (IsElement("intensity")) {
                pLight.mIntensity = ReadFloatFromTextContent();
                TestClosing("intensity");
            }
            else if (IsElement("falloff")) {
                pLight.mOuterAngle = ReadFloatFromTextContent();
                TestClosing("falloff");
            }
            else if (IsElement("hotspot_beam")) {
                pLight.mFalloffAngle = ReadFloatFromTextContent();
                TestClosing("hotspot_beam");
            }
            // OpenCOLLADA extensions
            // -------------------------------------------------------
            else if (IsElement("decay_falloff")) {
                pLight.mOuterAngle = ReadFloatFromTextContent();
                TestClosing("decay_falloff");
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "light") == 0)
                break;
        }
    }
}